

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void callTMres(lua_State *L,StkId res,TValue *f,TValue *p1,TValue *p2)

{
  StkId pTVar1;
  long lVar2;
  StkId pTVar3;
  
  pTVar3 = L->top;
  pTVar1 = L->stack;
  pTVar3->value = f->value;
  pTVar3->tt = f->tt;
  pTVar3 = L->top;
  pTVar3[1].value = p1->value;
  pTVar3[1].tt = p1->tt;
  pTVar3 = L->top;
  pTVar3[2].value = p2->value;
  pTVar3[2].tt = p2->tt;
  pTVar3 = L->top;
  if ((long)L->stack_last - (long)pTVar3 < 0x31) {
    luaD_growstack(L,3);
    pTVar3 = L->top;
  }
  lVar2 = (long)res - (long)pTVar1;
  L->top = pTVar3 + 3;
  luaD_call(L,pTVar3,1);
  pTVar3 = L->top;
  pTVar1 = L->stack;
  L->top = pTVar3 + -1;
  *(Value *)((long)pTVar1 + lVar2) = pTVar3[-1].value;
  *(int *)((long)pTVar1 + lVar2 + 8) = pTVar3[-1].tt;
  return;
}

Assistant:

static void callTMres (lua_State *L, StkId res, const TValue *f,
                        const TValue *p1, const TValue *p2) {
  ptrdiff_t result = savestack(L, res);
  setobj2s(L, L->top, f);  /* push function */
  setobj2s(L, L->top+1, p1);  /* 1st argument */
  setobj2s(L, L->top+2, p2);  /* 2nd argument */
  luaD_checkstack(L, 3);
  L->top += 3;
  luaD_call(L, L->top - 3, 1);
  res = restorestack(L, result);
  L->top--;
  setobjs2s(L, res, L->top);
}